

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringBuilder.hpp
# Opt level: O0

char (*) [2]
StringBuilder<unsigned_long,char_const(&)[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
          (unsigned_long *arg,char (*args) [2],char *args_1,char (*args_2) [2],unsigned_long *args_3
          ,char (*args_4) [2],char *args_5,char (*args_6) [2])

{
  char *in_RSI;
  char (*in_RDI) [2];
  char (*in_R8) [2];
  char *in_R9;
  unsigned_long *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  string local_50 [8];
  char (*in_stack_ffffffffffffffb8) [2];
  unsigned_long *in_stack_ffffffffffffffc0;
  char (*in_stack_ffffffffffffffc8) [2];
  char (*args_5_00) [2];
  
  args_5_00 = in_RDI;
  StringBuilder<unsigned_long>(in_stack_ffffffffffffff58);
  StringBuilder<char[2],char&,char_const(&)[2],unsigned_long&,char_const(&)[2],char&,char_const(&)[2]>
            (in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_RSI,args_5_00);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string(local_50);
  return in_RDI;
}

Assistant:

std::string StringBuilder(const T & arg, Targs && ... args)
{
    return StringBuilder(arg) + StringBuilder(std::forward<Targs>(args)...);
}